

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_into_internal<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *value,hash_type hash,
          uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  index_pointer node_00;
  ulong uVar1;
  size_t i;
  index_pointer leaf;
  internal_node *piVar2;
  index_pointer *piVar3;
  undefined4 uVar4;
  pair<pstore::index::details::index_pointer,_bool> pVar5;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_48;
  
  details::internal_node::get_node(&local_48,transaction->db_,node);
  if (local_48.second == (internal_node *)0x0) {
    assert_failed("internal != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x32c);
  }
  if (((local_48.second)->bitmap_ >> (hash & 0x3f) & 1) == 0) {
    piVar2 = details::internal_node::
             make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                       (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                          **)(this + 8),node,local_48.second);
    leaf.addr_.a_ =
         store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                   (this,transaction,value,parents);
    details::internal_node::insert_child(piVar2,hash,leaf,parents);
    node.internal_ = piVar2 | 3;
    uVar4 = 0;
  }
  else {
    i = POPCOUNT((local_48.second)->bitmap_ & (1L << ((byte)hash & 0x3f)) - 1U);
    node_00 = (local_48.second)->children_[i];
    pVar5 = insert_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                      (this,transaction,node_00,value,hash >> 6,shifts + 6,parents,is_upsert);
    uVar4 = pVar5._8_4_;
    if (pVar5.first.internal_ != node_00.internal_) {
      piVar2 = details::internal_node::
               make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                         (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                            **)(this + 8),node,local_48.second);
      piVar3 = details::internal_node::operator[](piVar2,i);
      hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
      ::delete_node((hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                     *)this,*piVar3,shifts + 6);
      piVar3->internal_ = (internal_node *)pVar5.first;
      node.internal_ = piVar2 | 3;
    }
    uVar1 = (parents.ptr_)->elements_;
    if (0xc < uVar1) {
      assert_failed("elements_ < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                    ,100);
    }
    (parents.ptr_)->elements_ = uVar1 + 1;
    ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)node;
    ((parents.ptr_)->c_)._M_elems[uVar1].position = i;
  }
  if (local_48.first.
      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.first.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pVar5._8_4_ = uVar4;
  pVar5.first.internal_ = node.internal_;
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_internal (
            transaction_base & transaction, index_pointer node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            std::shared_ptr<internal_node const> iptr;
            internal_node const * internal = nullptr;
            std::tie (iptr, internal) = internal_node::get_node (transaction.db (), node);
            PSTORE_ASSERT (internal != nullptr);

            // Now work out which of the children we're going to be visiting next.
            index_pointer child_slot;
            auto index = std::size_t{0};
            std::tie (child_slot, index) = internal->lookup (hash & details::hash_index_mask);

            // If this slot isn't used, then ensure the node is on the heap, write the new leaf node
            // and point to it.
            if (index == details::not_found) {
                internal_node * const inode =
                    internal_node::make_writable (internals_container_.get (), node, *internal);
                inode->insert_child (
                    hash, index_pointer{this->store_leaf_node (transaction, value, parents)},
                    parents);
                return {index_pointer{inode}, false};
            }

            shifts += details::hash_index_bits;
            hash >>= details::hash_index_bits;

            // update child_slot
            bool key_exists;
            index_pointer new_child;
            std::tie (new_child, key_exists) = this->insert_node (transaction, child_slot, value,
                                                                  hash, shifts, parents, is_upsert);

            // If the insertion resulted in our child node being reallocated, then this node needs
            // to be heap-allocated and the child reference updated. The original child pointer may
            // also need to be freed.
            if (new_child != child_slot) {
                internal_node * const inode =
                    internal_node::make_writable (internals_container_.get (), node, *internal);

                // Release a previous heap-allocated instance.
                index_pointer & child = (*inode)[index];
                this->delete_node (child, shifts);
                child = new_child;
                node = inode;
            }

            parents->push (details::parent_type{node, index});
            return {node, key_exists};
        }